

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<unsigned_long> * __thiscall
irr::core::string<unsigned_long>::operator=(string<unsigned_long> *this,char *c)

{
  s32 l;
  unsigned_long *puVar1;
  long lVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  puVar3 = this->array;
  if (c == (char *)0x0) {
    if (puVar3 == (unsigned_long *)0x0) {
      puVar3 = (unsigned_long *)operator_new__(8);
      this->array = puVar3;
      this->allocated = 1;
      this->used = 1;
    }
    *puVar3 = 0;
  }
  else if (puVar3 != (unsigned_long *)c) {
    uVar4 = 8;
    for (lVar5 = 1; c[lVar5 + -1] != '\0'; lVar5 = lVar5 + 1) {
      uVar4 = uVar4 + 8;
    }
    this->used = (s32)lVar5;
    this->allocated = (s32)lVar5;
    puVar1 = (unsigned_long *)operator_new__(uVar4);
    this->array = puVar1;
    lVar2 = 0;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      this->array[lVar2] = (long)c[lVar2];
      lVar2 = lVar2 + 1;
    }
    if (puVar3 != (unsigned_long *)0x0) {
      operator_delete__(puVar3);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}